

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_state.cc
# Opt level: O0

void __thiscall StateVar::GenAccessFunction(StateVar *this,Output *out_h,Env *env)

{
  undefined8 uVar1;
  char *pcVar2;
  char *pcVar3;
  Env *in_RSI;
  ID *in_stack_ffffffffffffff88;
  ID *in_stack_ffffffffffffffb0;
  Type *in_stack_ffffffffffffffb8;
  string local_38 [56];
  
  Type::DataTypeConstRefStr_abi_cxx11_(in_stack_ffffffffffffffb8);
  uVar1 = std::__cxx11::string::c_str();
  pcVar2 = Env::RValue((Env *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  pcVar3 = Env::LValue(in_RSI,in_stack_ffffffffffffff88);
  Output::println((Output *)in_RSI,"%s %s const\t{ return %s; }",uVar1,pcVar2,pcVar3);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void StateVar::GenAccessFunction(Output* out_h, Env* env)
	{
	out_h->println("%s %s const	{ return %s; }", type_->DataTypeConstRefStr().c_str(),
	               env->RValue(id_), env->LValue(id_));
	}